

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Misc.hpp
# Opt level: O0

bool openInput(string *filePath,BamReader *br)

{
  bool bVar1;
  ostream *poVar2;
  string *in_stack_ffffffffffffff88;
  BamReader *in_stack_ffffffffffffff90;
  undefined1 local_40 [8];
  string indexPath;
  BamReader *br_local;
  string *filePath_local;
  
  indexPath.field_2._8_8_ = br;
  bVar1 = BamTools::BamReader::Open(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  if (bVar1) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
                   filePath,&indexExt_abi_cxx11_);
    filePath_local._7_1_ =
         BamTools::BamReader::OpenIndex(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    if (!filePath_local._7_1_) {
      poVar2 = std::operator<<((ostream *)&std::cerr,"ERROR:BamTools Could not open index ");
      poVar2 = std::operator<<(poVar2,(string *)local_40);
      std::operator<<(poVar2,'\n');
    }
    std::__cxx11::string::~string((string *)local_40);
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cerr,"ERROR:BamTools Could not open ");
    poVar2 = std::operator<<(poVar2,(string *)filePath);
    std::operator<<(poVar2,'\n');
    filePath_local._7_1_ = false;
  }
  return filePath_local._7_1_;
}

Assistant:

inline bool openInput(const std::string &filePath, BamTools::BamReader &br)
{
    if (!br.Open(filePath))
    {
        std::cerr << "ERROR:BamTools Could not open " << filePath << '\n';
        return false;
    }
    std::string indexPath = filePath + indexExt;
    if (!br.OpenIndex(indexPath))
    {
        std::cerr << "ERROR:BamTools Could not open index " << indexPath << '\n';
        return false;
    }
    return true;
}